

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Config.h
# Opt level: O2

bool __thiscall Jupiter::Config::get<bool>(Config *this,string_view in_key,bool in_default_value)

{
  const_iterator cVar1;
  char *extraout_RDX;
  basic_string_view<char,_std::char_traits<char>_> in_string;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  
  local_18._M_str = in_key._M_str;
  local_18._M_len = in_key._M_len;
  cVar1 = std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,jessilib::text_equali,jessilib::text_hashi,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::_M_find_tr<std::basic_string_view<char,std::char_traits<char>>,void,void>
                    ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,jessilib::text_equali,jessilib::text_hashi,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)(this + 0x28),&local_18);
  if (cVar1.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
      ._M_cur != (__node_type *)0x0) {
    in_string._M_str = extraout_RDX;
    in_string._M_len =
         *(size_t *)
          ((long)cVar1.
                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                 ._M_cur + 0x28);
    in_default_value =
         asBool<char>(*(Jupiter **)
                       ((long)cVar1.
                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                              ._M_cur + 0x30),in_string);
  }
  return in_default_value;
}

Assistant:

inline T Jupiter::Config::get(std::string_view in_key, T in_default_value) const {
	auto result = m_table.find(JUPITER_WRAP_MAP_KEY(in_key));

	if (result == m_table.end()) {
		return in_default_value;
	}

	return from_string<T>(result->second);
}